

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O1

void defyx_calculate_hash(defyx_vm *machine,void *input,size_t inputSize,void *output)

{
  int iVar1;
  uint64_t tempHash [8];
  
  blake2b(tempHash,0x40,input,inputSize,(void *)0x0,0);
  sipesh(tempHash,0x40,input,inputSize,input,inputSize,0,0);
  k12(input,inputSize,tempHash);
  (*machine->_vptr_defyx_vm[6])(machine,tempHash);
  defyx_vm::resetRoundingMode(machine);
  iVar1 = 3;
  do {
    (*machine->_vptr_defyx_vm[7])(machine,tempHash);
    blake2b(tempHash,0x40,&machine->reg,0x100,(void *)0x0,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  (*machine->_vptr_defyx_vm[7])(machine,tempHash);
  (*machine->_vptr_defyx_vm[3])(machine,output,0x20);
  return;
}

Assistant:

void defyx_calculate_hash(defyx_vm *machine, const void *input, size_t inputSize, void *output) {
		assert(machine != nullptr);
		assert(inputSize == 0 || input != nullptr);
		assert(output != nullptr);
		alignas(16) uint64_t tempHash[8];
		int blakeResult = blake2b(tempHash, sizeof(tempHash), input, inputSize, nullptr, 0);
		int yescryptRH = sipesh(tempHash, sizeof(tempHash), input, inputSize, input, inputSize, 0, 0);
		int kangarooTwelve = k12(input, inputSize, tempHash);
		assert(blakeResult == 0);
		machine->initScratchpad(&tempHash);
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(&tempHash);
			blakeResult = blake2b(tempHash, sizeof(tempHash), machine->getRegisterFile(), sizeof(defyx::RegisterFile), nullptr, 0);
			assert(blakeResult == 0);
		}
		machine->run(&tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
	}